

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KokkosTime.cpp
# Opt level: O0

void anon_unknown.dwarf_460de2::KokkosTime::kokkostime_register(Caliper *c,Channel *chn)

{
  KokkosTime *this;
  Events *pEVar1;
  ostream *poVar2;
  socklen_t in_ECX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  string local_2a8;
  Log local_288;
  anon_class_8_1_0902ba13 local_80;
  function<void_(cali::Caliper_*,_cali::Channel_*)> local_78;
  anon_class_8_1_0902ba13 local_58;
  function<void_(cali::Caliper_*,_cali::Channel_*)> local_50;
  KokkosTime *local_20;
  KokkosTime *instance;
  Channel *chn_local;
  Caliper *c_local;
  
  instance = (KokkosTime *)chn;
  chn_local = (Channel *)c;
  this = (KokkosTime *)operator_new(0x10);
  KokkosTime(this,(Caliper *)chn_local,(Channel *)instance);
  local_20 = this;
  pEVar1 = cali::Channel::events((Channel *)instance);
  local_58.instance = local_20;
  std::function<void(cali::Caliper*,cali::Channel*)>::
  function<(anonymous_namespace)::KokkosTime::kokkostime_register(cali::Caliper*,cali::Channel*)::_lambda(cali::Caliper*,cali::Channel*)_1_,void>
            ((function<void(cali::Caliper*,cali::Channel*)> *)&local_50,&local_58);
  cali::util::callback<void_(cali::Caliper_*,_cali::Channel_*)>::connect
            (&pEVar1->post_init_evt,(int)&local_50,__addr,in_ECX);
  std::function<void_(cali::Caliper_*,_cali::Channel_*)>::~function(&local_50);
  pEVar1 = cali::Channel::events((Channel *)instance);
  local_80.instance = local_20;
  std::function<void(cali::Caliper*,cali::Channel*)>::
  function<(anonymous_namespace)::KokkosTime::kokkostime_register(cali::Caliper*,cali::Channel*)::_lambda(cali::Caliper*,cali::Channel*)_2_,void>
            ((function<void(cali::Caliper*,cali::Channel*)> *)&local_78,&local_80);
  cali::util::callback<void_(cali::Caliper_*,_cali::Channel_*)>::connect
            (&pEVar1->finish_evt,(int)&local_78,__addr_00,in_ECX);
  std::function<void_(cali::Caliper_*,_cali::Channel_*)>::~function(&local_78);
  cali::Log::Log(&local_288,1);
  poVar2 = cali::Log::stream(&local_288);
  cali::Channel::name_abi_cxx11_(&local_2a8,(Channel *)instance);
  poVar2 = std::operator<<(poVar2,(string *)&local_2a8);
  poVar2 = std::operator<<(poVar2,": Registered kokkostime service");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_2a8);
  cali::Log::~Log(&local_288);
  return;
}

Assistant:

static void kokkostime_register(Caliper* c, Channel* chn)
    {

        auto* instance = new KokkosTime(c, chn);
        chn->events().post_init_evt.connect([instance](Caliper* c, Channel* chn) {
            kokkosp_callbacks.kokkosp_begin_parallel_for_callback.connect(
                [&](const char* name, const uint32_t, uint64_t*) { instance->pushRegion(name, "kokkos.parallel_for"); }
            );
            kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback.connect(
                [&](const char* name, const uint32_t, uint64_t*) {
                    instance->pushRegion(name, "kokkos.parallel_reduce");
                }
            );
            kokkosp_callbacks.kokkosp_begin_parallel_scan_callback.connect(
                [&](const char* name, const uint32_t, uint64_t*) { instance->pushRegion(name, "kokkos.parallel_scan"); }
            );
            kokkosp_callbacks.kokkosp_begin_fence_callback.connect([&](const char* name, const uint32_t, uint64_t*) {
                instance->pushRegion(name, "kokkos.fence");
            });
            kokkosp_callbacks.kokkosp_end_parallel_for_callback.connect([&](const uint64_t) { instance->popRegion(); });
            kokkosp_callbacks.kokkosp_end_parallel_reduce_callback.connect([&](const uint64_t) {
                instance->popRegion();
            });
            kokkosp_callbacks.kokkosp_end_parallel_scan_callback.connect([&](const uint64_t) { instance->popRegion(); }
            );
            kokkosp_callbacks.kokkosp_end_fence_callback.connect([&](const uint64_t) { instance->popRegion(); });
            kokkosp_callbacks.kokkosp_push_region_callback.connect([&](const char* regionName) {
                instance->pushRegion(regionName, "kokkos.user_region");
            });
            kokkosp_callbacks.kokkosp_pop_region_callback.connect([&]() { instance->popRegion(); });
        });
        chn->events().finish_evt.connect([instance](Caliper*, Channel*) { delete instance; });

        Log(1).stream() << chn->name() << ": Registered kokkostime service" << std::endl;
    }